

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O0

void __thiscall Server::~Server(Server *this)

{
  int in_ESI;
  Server *this_local;
  
  close(this,in_ESI);
  std::vector<int,_std::allocator<int>_>::~vector(&this->_staleFileDescriptors);
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
  ~vector(&this->_clientSockets);
  std::function<void_(std::weak_ptr<ClientSocket>)>::~function(&this->_handleRead);
  std::function<void_(std::weak_ptr<ClientSocket>)>::~function(&this->_handleAccept);
  return;
}

Assistant:

Server::~Server()
{
  this->close();
}